

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

void __thiscall
CTcTokenizer::mark_full_exp_tokens
          (CTcTokenizer *this,CTcTokString *dstbuf,CTcTokString *srcbuf,int append)

{
  bool bVar1;
  char *pcVar2;
  tc_toktyp_t tVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  char ch;
  utf8_ptr p;
  CTcToken tok;
  tok_embed_ctx ec;
  undefined1 local_129;
  CTcTokString *local_128;
  char *local_120;
  utf8_ptr local_118;
  CTcTokenizer *local_110;
  CTcToken local_108;
  tok_embed_ctx local_e0;
  
  local_118.p_ = (char *)0x0;
  local_e0.level = 0;
  local_e0.s = (tok_embed_level *)0x0;
  local_128 = dstbuf;
  local_110 = this;
  if (append == 0) {
    (*dstbuf->_vptr_CTcTokString[9])();
  }
  local_120 = srcbuf->buf_;
  local_118.p_ = local_120;
  do {
    tVar3 = next_on_line(srcbuf,&local_118,&local_108,&local_e0,1);
    pcVar2 = local_108.text_;
    if (tVar3 == TOKT_EOF) {
      bVar1 = false;
    }
    else {
      bVar1 = true;
      if ((tVar3 == TOKT_SYM) && ((local_108._32_1_ & 1) == 0)) {
        iVar4 = (*local_110->defines_->_vptr_CTcMacroTable[4])
                          (local_110->defines_,local_108.text_,local_108.text_len_);
        if ((CTcHashEntryPp *)CONCAT44(extraout_var,iVar4) != (CTcHashEntryPp *)0x0) {
          iVar4 = scan_for_prior_expansion
                            (local_118,srcbuf->buf_ + srcbuf->buf_len_,
                             (CTcHashEntryPp *)CONCAT44(extraout_var,iVar4));
          if (iVar4 != 0) {
            lVar5 = (long)pcVar2 - (long)local_120;
            if (local_120 <= pcVar2 && lVar5 != 0) {
              (*local_128->_vptr_CTcTokString[4])(local_128,local_120,lVar5);
            }
            local_129 = 2;
            (*local_128->_vptr_CTcTokString[4])(local_128,&local_129,1);
            local_120 = local_108.text_;
          }
        }
      }
    }
  } while (bVar1);
  if (local_120 < local_108.text_) {
    (*local_128->_vptr_CTcTokString[4])();
  }
  remove_end_markers(local_128);
  return;
}

Assistant:

void CTcTokenizer::mark_full_exp_tokens(CTcTokString *dstbuf,
                                        const CTcTokString *srcbuf,
                                        int append) const
{
    utf8_ptr p;
    CTcToken tok;
    const char *start;
    tok_embed_ctx ec;

    /* clear the output buffer if we're not appending to existing text */
    if (!append)
        dstbuf->clear_text();

    /* remember the starting point */
    start = srcbuf->get_text();

    /* scan the source buffer */
    p.set((char *)start);
    for (;;)
    {
        CTcHashEntryPp *cur_entry;
        tc_toktyp_t typ;
        char ch;

        /* get the next token; stop at the end of the line */
        typ = next_on_line(srcbuf, &p, &tok, &ec, TRUE);
        if (typ == TOKT_EOF)
            break;

        /* 
         *   if this macro token is being expanded, and it's not already
         *   marked for no more expansion, mark it 
         */
        if (typ == TOKT_SYM
            && !tok.get_fully_expanded()
            && (cur_entry = find_define(tok.get_text(),
                                        tok.get_text_len())) != 0
            && scan_for_prior_expansion(p, srcbuf->get_text_end(), cur_entry))
        {
            /* 
             *   This token has been fully expanded in the substitution
             *   buffer but hasn't yet been marked as such - we must
             *   insert the fully-expanded marker.  First, add up to the
             *   current point to the output buffer.  
             */
            if (tok.get_text() > start)
                dstbuf->append(start, tok.get_text() - start);

            /* add the fully-expanded marker */
            ch = TOK_FULLY_EXPANDED_FLAG;
            dstbuf->append(&ch, 1);

            /* the new starting point is the start of the symbol token */
            start = tok.get_text();
        }
    }

    /* copy any remaining text to the output */
    if (tok.get_text() > start)
        dstbuf->append(start, tok.get_text() - start);

    /* 
     *   Remove any macro expansion end markers from the output buffer.
     *   We don't want to leave these around, because they don't apply to
     *   the enclosing buffer into which we'll substitute this result.
     *   Note that we've already ensured that these markers will be
     *   respected for the substitution text by inserting "fully expanded"
     *   markers in front of each token to which any of the markers we're
     *   removing should apply.  
     */
    remove_end_markers(dstbuf);
}